

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.h
# Opt level: O0

void __thiscall LParserException::LParserException(LParserException *this,string *detail)

{
  string *detail_local;
  LParserException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__LParserException_00156558;
  std::__cxx11::string::string((string *)&this->detail);
  std::__cxx11::string::operator=((string *)&this->detail,(string *)detail);
  return;
}

Assistant:

explicit LParserException(std::string &&detail) {
        this->detail = std::move(detail);
    }